

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O0

__GMM_BUFFER_TYPE * __thiscall
GmmLib::GmmTextureCalc::GetBestRestrictions
          (GmmTextureCalc *this,__GMM_BUFFER_TYPE *pFirstBuffer,__GMM_BUFFER_TYPE *pSecondBuffer)

{
  uint uVar1;
  GMM_GFX_SIZE_T local_70;
  GMM_GFX_SIZE_T local_68;
  uint32_t local_5c;
  GMM_GFX_SIZE_T local_58;
  uint32_t local_50;
  uint32_t local_4c;
  GMM_GFX_SIZE_T local_48;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  __GMM_BUFFER_TYPE *pSecondBuffer_local;
  __GMM_BUFFER_TYPE *pFirstBuffer_local;
  GmmTextureCalc *this_local;
  
  uVar1 = (*this->_vptr_GmmTextureCalc[3])(this,pFirstBuffer);
  if ((uVar1 & 1) == 0) {
    if (pSecondBuffer->Alignment < pFirstBuffer->Alignment) {
      local_2c = pFirstBuffer->Alignment;
    }
    else {
      local_2c = pSecondBuffer->Alignment;
    }
    pFirstBuffer->Alignment = local_2c;
    if (pSecondBuffer->PitchAlignment < pFirstBuffer->PitchAlignment) {
      local_30 = pFirstBuffer->PitchAlignment;
    }
    else {
      local_30 = pSecondBuffer->PitchAlignment;
    }
    pFirstBuffer->PitchAlignment = local_30;
    if (pSecondBuffer->RenderPitchAlignment < pFirstBuffer->RenderPitchAlignment) {
      local_34 = pFirstBuffer->RenderPitchAlignment;
    }
    else {
      local_34 = pSecondBuffer->RenderPitchAlignment;
    }
    pFirstBuffer->RenderPitchAlignment = local_34;
    if (pSecondBuffer->LockPitchAlignment < pFirstBuffer->LockPitchAlignment) {
      local_38 = pFirstBuffer->LockPitchAlignment;
    }
    else {
      local_38 = pSecondBuffer->LockPitchAlignment;
    }
    pFirstBuffer->LockPitchAlignment = local_38;
    if (pSecondBuffer->MinPitch < pFirstBuffer->MinPitch) {
      local_3c = pFirstBuffer->MinPitch;
    }
    else {
      local_3c = pSecondBuffer->MinPitch;
    }
    pFirstBuffer->MinPitch = local_3c;
    if (pSecondBuffer->MinAllocationSize < pFirstBuffer->MinAllocationSize) {
      local_48 = pFirstBuffer->MinAllocationSize;
    }
    else {
      local_48 = pSecondBuffer->MinAllocationSize;
    }
    pFirstBuffer->MinAllocationSize = local_48;
    if (pSecondBuffer->MinDepth < pFirstBuffer->MinDepth) {
      local_4c = pFirstBuffer->MinDepth;
    }
    else {
      local_4c = pSecondBuffer->MinDepth;
    }
    pFirstBuffer->MinDepth = local_4c;
    if (pSecondBuffer->MinHeight < pFirstBuffer->MinHeight) {
      local_50 = pFirstBuffer->MinHeight;
    }
    else {
      local_50 = pSecondBuffer->MinHeight;
    }
    pFirstBuffer->MinHeight = local_50;
    if (pSecondBuffer->MinWidth < pFirstBuffer->MinWidth) {
      local_58 = pFirstBuffer->MinWidth;
    }
    else {
      local_58 = pSecondBuffer->MinWidth;
    }
    pFirstBuffer->MinWidth = local_58;
    if (pFirstBuffer->MaxDepth < pSecondBuffer->MaxDepth) {
      local_5c = pFirstBuffer->MaxDepth;
    }
    else {
      local_5c = pSecondBuffer->MaxDepth;
    }
    pFirstBuffer->MaxDepth = local_5c;
    if (pFirstBuffer->MaxHeight < pSecondBuffer->MaxHeight) {
      local_68 = pFirstBuffer->MaxHeight;
    }
    else {
      local_68 = pSecondBuffer->MaxHeight;
    }
    pFirstBuffer->MaxHeight = local_68;
    if (pFirstBuffer->MaxWidth < pSecondBuffer->MaxWidth) {
      local_70 = pFirstBuffer->MaxWidth;
    }
    else {
      local_70 = pSecondBuffer->MaxWidth;
    }
    pFirstBuffer->MaxWidth = local_70;
    pFirstBuffer->NeedPow2LockAlignment =
         pFirstBuffer->NeedPow2LockAlignment | pSecondBuffer->NeedPow2LockAlignment;
  }
  else {
    memcpy(pFirstBuffer,pSecondBuffer,0x60);
  }
  return pFirstBuffer;
}

Assistant:

__GMM_BUFFER_TYPE *GmmLib::GmmTextureCalc::GetBestRestrictions(__GMM_BUFFER_TYPE *      pFirstBuffer,
                                                               const __GMM_BUFFER_TYPE *pSecondBuffer)
{
    GMM_DPF_ENTER;

    if(IsRestrictionInvalid(pFirstBuffer)) //default
    {
        *pFirstBuffer = *pSecondBuffer;
        return pFirstBuffer;
    }

    pFirstBuffer->Alignment = GFX_MAX(pFirstBuffer->Alignment,
                                      pSecondBuffer->Alignment);

    pFirstBuffer->PitchAlignment = GFX_MAX(pFirstBuffer->PitchAlignment,
                                           pSecondBuffer->PitchAlignment);

    pFirstBuffer->RenderPitchAlignment = GFX_MAX(pFirstBuffer->RenderPitchAlignment,
                                                 pSecondBuffer->RenderPitchAlignment);

    pFirstBuffer->LockPitchAlignment = GFX_MAX(pFirstBuffer->LockPitchAlignment,
                                               pSecondBuffer->LockPitchAlignment);

    pFirstBuffer->MinPitch = GFX_MAX(pFirstBuffer->MinPitch,
                                     pSecondBuffer->MinPitch);

    pFirstBuffer->MinAllocationSize = GFX_MAX(pFirstBuffer->MinAllocationSize,
                                              pSecondBuffer->MinAllocationSize);

    pFirstBuffer->MinDepth = GFX_MAX(pFirstBuffer->MinDepth,
                                     pSecondBuffer->MinDepth);

    pFirstBuffer->MinHeight = GFX_MAX(pFirstBuffer->MinHeight,
                                      pSecondBuffer->MinHeight);

    pFirstBuffer->MinWidth = GFX_MAX(pFirstBuffer->MinWidth,
                                     pSecondBuffer->MinWidth);

    pFirstBuffer->MaxDepth = GFX_MIN(pFirstBuffer->MaxDepth,
                                     pSecondBuffer->MaxDepth);

    pFirstBuffer->MaxHeight = GFX_MIN(pFirstBuffer->MaxHeight,
                                      pSecondBuffer->MaxHeight);

    pFirstBuffer->MaxWidth = GFX_MIN(pFirstBuffer->MaxWidth,
                                     pSecondBuffer->MaxWidth);

    pFirstBuffer->NeedPow2LockAlignment = pFirstBuffer->NeedPow2LockAlignment |
                                          pSecondBuffer->NeedPow2LockAlignment;

    GMM_DPF_EXIT;
    return pFirstBuffer;
}